

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

void __thiscall amrex::DistributionMapping::DistributionMapping(DistributionMapping *this)

{
  undefined1 uStack_9;
  
  std::__shared_ptr<amrex::DistributionMapping::Ref,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<amrex::DistributionMapping::Ref>>
            ((__shared_ptr<amrex::DistributionMapping::Ref,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<amrex::DistributionMapping::Ref> *)&uStack_9);
  return;
}

Assistant:

DistributionMapping::DistributionMapping ()
    :
    m_ref(std::make_shared<Ref>())
{
}